

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O2

int Signal::produceAudio(double *in,int inLength,short **out,int *outLength,double volume)

{
  short *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  
  if (in == (double *)0x0) {
    puts("Input buffer is NULL! Aborting audio samples production...");
    iVar2 = -1;
  }
  else {
    *outLength = inLength;
    psVar1 = *out;
    if (psVar1 == (short *)0x0) {
      psVar1 = (short *)malloc((long)(inLength * 2) * 2);
      *out = psVar1;
    }
    iVar2 = 0;
    uVar4 = (ulong)(uint)inLength;
    if (inLength < 1) {
      uVar4 = 0;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      sVar5 = (short)(int)(in[uVar3] * volume * 32767.0);
      psVar1[uVar3 * 2 + 1] = sVar5;
      psVar1[uVar3 * 2] = sVar5;
    }
  }
  return iVar2;
}

Assistant:

int Signal::produceAudio(double * in, int inLength, short ** out, int * outLength, double volume)
{
    int i;

    // Return error if input signal is empty
    if (in == NULL)
    {
    	printf("Input buffer is NULL! Aborting audio samples production...\n");
    	return -1;
    }

    // Output length is the same as input length
    *outLength = inLength;

    // If the output signal is not allocated, allocate it
    if (*out == NULL)
    {
    	*out = (short *) malloc(2 * (*outLength) * sizeof(short));
    }

    // Produce the final audio signal
    for (i = 0; i < *outLength; i++)
    {
        (*out)[2 * i] = (*out)[2 * i + 1] = (short) (in[i] * volume * 32767);
    }

    return 0;
}